

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::updateFtest(SPxSolverBase<double> *this)

{
  bool bVar1;
  int iVar2;
  UpdateVector<double> *pUVar3;
  SSVectorBase<double> *pSVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  Real RVar8;
  double dVar9;
  double dVar10;
  
  pUVar3 = this->theFvec;
  (this->updateViols).super_IdxSet.num = 0;
  dVar6 = entertol(this);
  lVar5 = (long)(pUVar3->thedelta).super_IdxSet.num;
  if (0 < lVar5) {
    dVar10 = -dVar6;
    lVar5 = lVar5 + 1;
    do {
      iVar2 = (pUVar3->thedelta).super_IdxSet.idx[lVar5 + -2];
      bVar1 = this->m_pricingViolUpToDate;
      if ((bVar1 == true) &&
         (dVar9 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2], dVar9 < dVar10)) {
        this->m_pricingViol = dVar9 + this->m_pricingViol;
      }
      dVar9 = (this->theFvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar2];
      dVar7 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2];
      if (dVar9 <= dVar7) {
        dVar7 = dVar9 - (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar2];
      }
      else {
        dVar7 = dVar7 - dVar9;
      }
      (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = dVar7;
      if ((this->sparsePricingLeave != true) || (dVar10 <= dVar7)) {
        if ((bVar1 != false) && (dVar7 < dVar10)) {
          this->m_pricingViol = this->m_pricingViol - dVar7;
        }
      }
      else {
        if (bVar1 != false) {
          this->m_pricingViol = this->m_pricingViol - dVar7;
        }
        if ((this->isInfeasible).data[iVar2] == 0) {
          DIdxSet::addIdx(&this->infeasibilities,iVar2);
          (this->isInfeasible).data[iVar2] = 1;
        }
        if (this->hyperPricingLeave == true) {
          DIdxSet::addIdx(&this->updateViols,iVar2);
        }
      }
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  if (0 < this->boundflips) {
    RVar8 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    pSVar4 = this->solveVector3;
    if (0 < (pSVar4->super_IdxSet).num) {
      dVar6 = -dVar6;
      lVar5 = 0;
      do {
        iVar2 = (pSVar4->super_IdxSet).idx[lVar5];
        if (RVar8 < ABS((pSVar4->super_VectorBase<double>).val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar2])) {
          bVar1 = this->m_pricingViolUpToDate;
          if ((bVar1 == true) &&
             (dVar10 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar2], dVar10 < dVar6)) {
            this->m_pricingViol = dVar10 + this->m_pricingViol;
          }
          dVar10 = (this->theFvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2];
          dVar9 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[iVar2];
          if (dVar10 <= dVar9) {
            dVar9 = dVar10 - (this->theLBbound).val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar2];
          }
          else {
            dVar9 = dVar9 - dVar10;
          }
          (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2] = dVar9;
          if ((this->sparsePricingLeave != true) || (dVar6 <= dVar9)) {
            if ((bVar1 != false) && (dVar9 < dVar6)) {
              this->m_pricingViol = this->m_pricingViol - dVar9;
            }
          }
          else {
            if (bVar1 != false) {
              this->m_pricingViol = this->m_pricingViol - dVar9;
            }
            if ((this->isInfeasible).data[iVar2] == 0) {
              DIdxSet::addIdx(&this->infeasibilities,iVar2);
              (this->isInfeasible).data[iVar2] = 1;
            }
          }
        }
        lVar5 = lVar5 + 1;
        pSVar4 = this->solveVector3;
      } while (lVar5 < (pSVar4->super_IdxSet).num);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateFtest()
{
   const IdxSet& idx = theFvec->idx();
   VectorBase<R>& ftest = theCoTest;      // |== fTest()|
   assert(&ftest == &fTest());

   assert(type() == LEAVE);

   updateViols.clear();
   R theeps = entertol();

   for(int j = idx.size() - 1; j >= 0; --j)
   {
      int i = idx.index(j);

      if(m_pricingViolUpToDate && ftest[i] < -theeps)
         // violation was present before this iteration
         m_pricingViol += ftest[i];

      ftest[i] = ((*theFvec)[i] > theUBbound[i])
                 ? theUBbound[i] - (*theFvec)[i]
                 : (*theFvec)[i] - theLBbound[i];

      if(sparsePricingLeave && ftest[i] < -theeps)
      {
         assert(remainingRoundsLeave == 0);

         if(m_pricingViolUpToDate)
            m_pricingViol -= ftest[i];

         if(isInfeasible[i] == SPxPricer<R>::NOT_VIOLATED)
         {
            // this can cause problems - we cannot keep on adding indeces to infeasibilities,
            // because they are not deleted in hyper mode...
            //             if( !hyperPricingLeave )
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
         }

         if(hyperPricingLeave)
            updateViols.addIdx(i);
      }
      else if(m_pricingViolUpToDate && ftest[i] < -theeps)
         m_pricingViol -= ftest[i];
   }

   // if boundflips were performed, we need to update these indices as well
   if(boundflips > 0)
   {
      R eps = epsilon();

      for(int j = 0; j < solveVector3->size(); ++j)
      {
         if(spxAbs(solveVector3->value(j)) > eps)
         {
            int i = solveVector3->index(j);

            if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol += ftest[i];

            ftest[i] = ((*theFvec)[i] > theUBbound[i]) ? theUBbound[i] - (*theFvec)[i] :
                       (*theFvec)[i] - theLBbound[i];

            if(sparsePricingLeave && ftest[i] < -theeps)
            {
               assert(remainingRoundsLeave == 0);

               if(m_pricingViolUpToDate)
                  m_pricingViol -= ftest[i];

               if(!isInfeasible[i])
               {
                  infeasibilities.addIdx(i);
                  isInfeasible[i] = true;
               }
            }
            else if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol -= ftest[i];
         }
      }
   }
}